

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_intrin_sse2.c
# Opt level: O1

int64_t av1_block_error_lp_sse2(int16_t *coeff,int16_t *dqcoeff,intptr_t block_size)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (block_size < 1) {
    lVar5 = 0;
    lVar6 = 0;
  }
  else {
    lVar4 = 0;
    lVar5 = 0;
    lVar6 = 0;
    lVar7 = 0;
    lVar8 = 0;
    do {
      psVar1 = coeff + lVar4;
      psVar3 = coeff + lVar4 + 8;
      psVar2 = dqcoeff + lVar4;
      auVar10._0_2_ = *psVar2 - *psVar1;
      auVar10._2_2_ = psVar2[1] - psVar1[1];
      auVar10._4_2_ = psVar2[2] - psVar1[2];
      auVar10._6_2_ = psVar2[3] - psVar1[3];
      auVar10._8_2_ = psVar2[4] - psVar1[4];
      auVar10._10_2_ = psVar2[5] - psVar1[5];
      auVar10._12_2_ = psVar2[6] - psVar1[6];
      auVar10._14_2_ = psVar2[7] - psVar1[7];
      psVar1 = dqcoeff + lVar4 + 8;
      auVar9._0_2_ = *psVar1 - *psVar3;
      auVar9._2_2_ = psVar1[1] - psVar3[1];
      auVar9._4_2_ = psVar1[2] - psVar3[2];
      auVar9._6_2_ = psVar1[3] - psVar3[3];
      auVar9._8_2_ = psVar1[4] - psVar3[4];
      auVar9._10_2_ = psVar1[5] - psVar3[5];
      auVar9._12_2_ = psVar1[6] - psVar3[6];
      auVar9._14_2_ = psVar1[7] - psVar3[7];
      auVar10 = pmaddwd(auVar10,auVar10);
      auVar9 = pmaddwd(auVar9,auVar9);
      lVar5 = (ulong)auVar10._8_4_ + (auVar10._0_8_ & 0xffffffff) + lVar5;
      lVar6 = (ulong)auVar10._12_4_ + (ulong)auVar10._4_4_ + lVar6;
      lVar7 = (ulong)auVar9._8_4_ + (auVar9._0_8_ & 0xffffffff) + lVar7;
      lVar8 = (ulong)auVar9._12_4_ + (ulong)auVar9._4_4_ + lVar8;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 < block_size);
    lVar5 = lVar5 + lVar7;
    lVar6 = lVar6 + lVar8;
  }
  return lVar6 + lVar5;
}

Assistant:

int64_t av1_block_error_lp_sse2(const int16_t *coeff, const int16_t *dqcoeff,
                                intptr_t block_size) {
  assert(block_size % 16 == 0);
  assert(block_size >= 16);

  const __m128i zero = _mm_setzero_si128();
  __m128i accum_0 = zero;
  __m128i accum_1 = zero;

  for (int i = 0; i < block_size; i += 16) {
    // Load 8 elements for coeff and dqcoeff.
    const __m128i _coeff_0 = _mm_loadu_si128((const __m128i *)coeff);
    const __m128i _coeff_1 = _mm_loadu_si128((const __m128i *)(coeff + 8));
    const __m128i _dqcoeff_0 = _mm_loadu_si128((const __m128i *)dqcoeff);
    const __m128i _dqcoeff_1 = _mm_loadu_si128((const __m128i *)(dqcoeff + 8));
    // Compute the diff
    const __m128i diff_0 = _mm_sub_epi16(_dqcoeff_0, _coeff_0);
    const __m128i diff_1 = _mm_sub_epi16(_dqcoeff_1, _coeff_1);
    // Compute the error
    const __m128i error_0 = _mm_madd_epi16(diff_0, diff_0);
    const __m128i error_1 = _mm_madd_epi16(diff_1, diff_1);

    const __m128i error_lo_0 = _mm_unpacklo_epi32(error_0, zero);
    const __m128i error_lo_1 = _mm_unpacklo_epi32(error_1, zero);
    const __m128i error_hi_0 = _mm_unpackhi_epi32(error_0, zero);
    const __m128i error_hi_1 = _mm_unpackhi_epi32(error_1, zero);

    // Accumulate
    accum_0 = _mm_add_epi64(accum_0, error_lo_0);
    accum_1 = _mm_add_epi64(accum_1, error_lo_1);
    accum_0 = _mm_add_epi64(accum_0, error_hi_0);
    accum_1 = _mm_add_epi64(accum_1, error_hi_1);

    // Advance
    coeff += 16;
    dqcoeff += 16;
  }

  __m128i accum = _mm_add_epi64(accum_0, accum_1);
  // Reduce sum the register
  accum = reduce_sum_epi64(accum);

  // Store the results.
#if AOM_ARCH_X86_64
  return _mm_cvtsi128_si64(accum);
#else
  int64_t result;
  _mm_storel_epi64((__m128i *)&result, accum);
  return result;
#endif  // AOM_ARCH_X86_64
}